

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_stream_amend.c
# Opt level: O1

RK_S32 get_next_nal(RK_U8 *buf,RK_S32 *length)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint3 uVar7;
  uint3 uVar8;
  
  uVar1 = *length;
  uVar4 = uVar1;
  while (uVar5 = 0, 3 < (int)uVar4) {
    if (buf[2] == '\0') {
      uVar4 = uVar4 - 1;
      buf = buf + 1;
    }
    else {
      if (((*buf != '\0') || (buf[2] != '\x01')) || (buf[1] != '\0')) {
        uVar6 = uVar4 + (uVar4 == 0);
        uVar8 = 0xffffff;
        lVar2 = 0;
        goto LAB_002468bb;
      }
      buf = buf + 3;
      uVar4 = uVar4 - 3;
    }
  }
  goto LAB_00246906;
  while( true ) {
    uVar7 = uVar8 << 8;
    uVar8 = uVar7 | buf[lVar3];
    lVar2 = lVar3 + 1;
    if ((uint3)(uVar7 | buf[lVar3]) == 1) break;
LAB_002468bb:
    lVar3 = lVar2;
    if ((ulong)uVar6 - 1 == lVar3) goto LAB_002468f5;
  }
  uVar6 = (int)(lVar3 + 1) - 3;
LAB_002468f5:
  uVar5 = uVar1;
  if (lVar3 + 1U < (ulong)uVar4) {
    uVar5 = ~uVar4 + uVar1 + uVar6;
  }
LAB_00246906:
  *length = uVar1 - uVar5;
  return uVar5;
}

Assistant:

static RK_S32 get_next_nal(RK_U8 *buf, RK_S32 *length)
{
    RK_S32 i, consumed = 0;
    RK_S32 len = *length;
    RK_U8 *tmp_buf = buf;

    /* search start code */
    while (len >= 4) {
        if (tmp_buf[2] == 0) {
            len--;
            tmp_buf++;
            continue;
        }

        if (tmp_buf[0] != 0 || tmp_buf[1] != 0 || tmp_buf[2] != 1) {
            RK_U32 state = (RK_U32) - 1;
            RK_S32 has_nal = 0;

            for (i = 0; i < (RK_S32)len; i++) {
                state = (state << 8) | tmp_buf[i];
                if (((state >> 8) & 0xFFFFFF) == START_CODE) {
                    has_nal = 1;
                    i = i - 3;
                    break;
                }
            }

            if (has_nal) {
                len -= i;
                tmp_buf += i;
                consumed = *length - len - 1;
                break;
            }

            consumed = *length;
            break;
        }
        tmp_buf   += 3;
        len       -= 3;
    }

    *length = *length - consumed;
    return consumed;
}